

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O1

string * __thiscall
MPL::detail::ModelPackageImpl::setRootModel
          (string *__return_storage_ptr__,ModelPackageImpl *this,path *path,string *name,
          string *author,string *description)

{
  JsonMap *pJVar1;
  bool bVar2;
  runtime_error *this_00;
  string local_58;
  string *local_38;
  
  pJVar1 = (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
           _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
           super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = description;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"rootModelIdentifier","");
  bVar2 = JsonMap::hasKey(pJVar1,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    addItem(__return_storage_ptr__,this,path,name,author,local_38);
    pJVar1 = (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
             _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
             super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"rootModelIdentifier","");
    JsonMap::setString(pJVar1,&local_58,__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"A root model already exists in this package");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string ModelPackageImpl::setRootModel(const std::filesystem::path& path, const std::string& name, const std::string& author, const std::string& description)
{
    if (m_manifest->hasKey(kModelPackageRootModelKey)) {
        throw std::runtime_error("A root model already exists in this package");
    }
    
    auto identifier = addItem(path, name, author, description);
    m_manifest->setString(kModelPackageRootModelKey, identifier);
    return identifier;
}